

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O3

csafestring_t * safe_create(char *str)

{
  ulong uVar1;
  csafestring_t *pcVar2;
  size_t sVar3;
  char *pcVar4;
  ulong __size;
  
  pcVar2 = (csafestring_t *)malloc(0x10);
  pcVar2->buffer_length = 8;
  if (str == (char *)0x0) {
    pcVar4 = (char *)calloc(1,8);
    pcVar2->data = pcVar4;
  }
  else {
    sVar3 = strlen(str);
    uVar1 = 8;
    do {
      __size = uVar1;
      uVar1 = __size * 2;
    } while (__size < sVar3 + 1);
    pcVar2->buffer_length = __size;
    pcVar4 = (char *)malloc(__size);
    pcVar2->data = pcVar4;
    strcpy(pcVar4,str);
  }
  return pcVar2;
}

Assistant:

csafestring_t *safe_create(char *str) {
	csafestring_t *obj = (csafestring_t *) malloc(sizeof(csafestring_t));

#ifdef EXPERIMENTAL_SIZING
	obj->sizing_size = safe_getInitSize();
	obj->buffer_length = 1<<obj->sizing_size;
	sizing_size += obj->sizing_size;
#else
	obj->buffer_length = INIT_LENGTH_CALC;
#endif
		
	if ( str == NULL ) {
		obj->data = (char *) calloc(sizeof(char), obj->buffer_length);
	} else {
		size_t newLength = strlen(str) + 1;

		while ( obj->buffer_length < newLength ) {
			obj->buffer_length <<= 1;
			
#ifdef EXPERIMENTAL_SIZING
			obj->sizing_size++;
			sizing_size++;
#endif
			
		}
		obj->data = (char *) malloc(obj->buffer_length);
		strcpy(obj->data, str);
	}
	
#ifdef EXPERIMENTAL_SIZING
	sizing_count++;
#endif
	
	return obj;
}